

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void can_copy_empty(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  uint64_t uVar2;
  
  r = roaring_bitmap_create();
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  r_00 = roaring_bitmap_copy(r);
  uVar2 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar2 == 0),"roaring_bitmap_get_cardinality(bm1) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xdf);
  uVar2 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar2 == 0),"roaring_bitmap_get_cardinality(bm2) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe0);
  _Var1 = roaring_bitmap_is_empty(r);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(bm1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe1);
  _Var1 = roaring_bitmap_is_empty(r_00);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(bm2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe2);
  roaring_bitmap_add(r,3);
  roaring_bitmap_add(r_00,5);
  uVar2 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar2 == 1),"roaring_bitmap_get_cardinality(bm1) == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe5);
  uVar2 = roaring_bitmap_get_cardinality(r_00);
  _assert_true((ulong)(uVar2 == 1),"roaring_bitmap_get_cardinality(bm2) == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe6);
  _Var1 = roaring_bitmap_contains(r,3);
  _assert_true((ulong)_Var1,"roaring_bitmap_contains(bm1, 3)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe7);
  _Var1 = roaring_bitmap_contains(r_00,5);
  _assert_true((ulong)_Var1,"roaring_bitmap_contains(bm2, 5)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe8);
  _Var1 = roaring_bitmap_contains(r_00,3);
  _assert_true((ulong)!_Var1,"!roaring_bitmap_contains(bm2, 3)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xe9);
  _Var1 = roaring_bitmap_contains(r,5);
  _assert_true((ulong)!_Var1,"!roaring_bitmap_contains(bm1, 5)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0xea);
  roaring_bitmap_free(r);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

void can_copy_empty(bool copy_on_write) {
    roaring_bitmap_t *bm1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(bm1, copy_on_write);
    roaring_bitmap_t *bm2 = roaring_bitmap_copy(bm1);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 0);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 0);
    assert_true(roaring_bitmap_is_empty(bm1));
    assert_true(roaring_bitmap_is_empty(bm2));
    roaring_bitmap_add(bm1, 3);
    roaring_bitmap_add(bm2, 5);
    assert_true(roaring_bitmap_get_cardinality(bm1) == 1);
    assert_true(roaring_bitmap_get_cardinality(bm2) == 1);
    assert_true(roaring_bitmap_contains(bm1, 3));
    assert_true(roaring_bitmap_contains(bm2, 5));
    assert_true(!roaring_bitmap_contains(bm2, 3));
    assert_true(!roaring_bitmap_contains(bm1, 5));
    roaring_bitmap_free(bm1);
    roaring_bitmap_free(bm2);
}